

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

void __thiscall
phyr::Film::Film(Film *this,Point2i *resolution,Bounds2f *cropWindow,
                unique_ptr<phyr::Filter,_std::default_delete<phyr::Filter>_> *_filter,
                double filmSize,string *filename,double scale)

{
  double dVar1;
  undefined1 auVar2 [16];
  int *piVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  pointer pFVar7;
  void *pvVar8;
  double *in_RDX;
  int *in_RSI;
  undefined8 *in_RDI;
  string *in_R8;
  undefined4 in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Db;
  undefined8 in_XMM1_Qa;
  double py;
  double px;
  int x;
  int y;
  int offset;
  double invFilterTableSize;
  Pixel *in_stack_fffffffffffffe98;
  Bounds2<int> *in_stack_fffffffffffffea0;
  Pixel *in_stack_fffffffffffffeb0;
  double dVar9;
  Point2<int> *in_stack_fffffffffffffeb8;
  Bounds2<int> *in_stack_fffffffffffffec0;
  void *local_120;
  Point2<double> local_a8;
  double local_98;
  double local_90;
  int local_84;
  int local_80;
  int local_7c;
  double local_78;
  Point2<int> local_64;
  Point2<int> local_5c;
  undefined8 local_54;
  undefined8 uStack_4c;
  undefined8 local_38;
  string *local_30;
  double *local_18;
  int *local_10;
  
  *in_RDI = *(undefined8 *)in_RSI;
  in_RDI[1] = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da) * 0.001;
  local_38 = in_XMM1_Qa;
  local_30 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::unique_ptr<phyr::Filter,_std::default_delete<phyr::Filter>_>::unique_ptr
            ((unique_ptr<phyr::Filter,_std::default_delete<phyr::Filter>_> *)
             in_stack_fffffffffffffea0,
             (unique_ptr<phyr::Filter,_std::default_delete<phyr::Filter>_> *)
             in_stack_fffffffffffffe98);
  std::__cxx11::string::string((string *)(in_RDI + 3),local_30);
  Bounds2<int>::Bounds2((Bounds2<int> *)in_stack_fffffffffffffeb0);
  in_RDI[9] = local_38;
  std::unique_ptr<phyr::Film::Pixel[],std::default_delete<phyr::Film::Pixel[]>>::
  unique_ptr<std::default_delete<phyr::Film::Pixel[]>,void>
            ((unique_ptr<phyr::Film::Pixel[],_std::default_delete<phyr::Film::Pixel[]>_> *)
             in_stack_fffffffffffffea0);
  std::mutex::mutex((mutex *)0x182a3b);
  piVar3 = local_10;
  dVar1 = local_18[1];
  dVar9 = ceil((double)*local_10 * *local_18);
  dVar1 = ceil((double)piVar3[1] * dVar1);
  Point2<int>::Point2(&local_5c,(int)dVar9,(int)dVar1);
  dVar1 = local_18[3];
  dVar9 = ceil((double)*local_10 * local_18[2]);
  dVar1 = ceil((double)local_10[1] * dVar1);
  Point2<int>::Point2(&local_64,(int)dVar9,(int)dVar1);
  Bounds2<int>::Bounds2
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
             (Point2<int> *)in_stack_fffffffffffffeb0);
  in_RDI[7] = local_54;
  in_RDI[8] = uStack_4c;
  iVar4 = Bounds2<int>::area(in_stack_fffffffffffffea0);
  uVar5 = (ulong)iVar4;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar5;
  uVar6 = SUB168(auVar2 * ZEXT816(0x40),0);
  if (SUB168(auVar2 * ZEXT816(0x40),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  local_120 = operator_new__(uVar6);
  if (uVar5 != 0) {
    pvVar8 = (void *)((long)local_120 + uVar5 * 0x40);
    do {
      Pixel::Pixel(in_stack_fffffffffffffeb0);
      local_120 = (void *)((long)local_120 + 0x40);
    } while (local_120 != pvVar8);
  }
  std::unique_ptr<phyr::Film::Pixel[],std::default_delete<phyr::Film::Pixel[]>>::
  unique_ptr<phyr::Film::Pixel*,std::default_delete<phyr::Film::Pixel[]>,void,bool>
            ((unique_ptr<phyr::Film::Pixel[],_std::default_delete<phyr::Film::Pixel[]>_> *)
             in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::unique_ptr<phyr::Film::Pixel[],_std::default_delete<phyr::Film::Pixel[]>_>::operator=
            ((unique_ptr<phyr::Film::Pixel[],_std::default_delete<phyr::Film::Pixel[]>_> *)
             in_stack_fffffffffffffea0,
             (unique_ptr<phyr::Film::Pixel[],_std::default_delete<phyr::Film::Pixel[]>_> *)
             in_stack_fffffffffffffe98);
  std::unique_ptr<phyr::Film::Pixel[],_std::default_delete<phyr::Film::Pixel[]>_>::~unique_ptr
            ((unique_ptr<phyr::Film::Pixel[],_std::default_delete<phyr::Film::Pixel[]>_> *)
             in_stack_fffffffffffffeb0);
  local_78 = 0.0625;
  local_7c = 0;
  for (local_80 = 0; local_80 < 0x10; local_80 = local_80 + 1) {
    for (local_84 = 0; local_84 < 0x10; local_84 = local_84 + 1) {
      dVar1 = (double)local_84;
      dVar9 = 0.5;
      pFVar7 = std::unique_ptr<phyr::Filter,_std::default_delete<phyr::Filter>_>::operator->
                         ((unique_ptr<phyr::Filter,_std::default_delete<phyr::Filter>_> *)0x182ca1);
      local_90 = (dVar1 + 0.5) * (pFVar7->radius).x * local_78;
      dVar9 = (double)local_80 + dVar9;
      pFVar7 = std::unique_ptr<phyr::Filter,_std::default_delete<phyr::Filter>_>::operator->
                         ((unique_ptr<phyr::Filter,_std::default_delete<phyr::Filter>_> *)0x182ce9);
      local_98 = dVar9 * (pFVar7->radius).y * local_78;
      pFVar7 = std::unique_ptr<phyr::Filter,_std::default_delete<phyr::Filter>_>::operator->
                         ((unique_ptr<phyr::Filter,_std::default_delete<phyr::Filter>_> *)0x182d18);
      Point2<double>::Point2(&local_a8,local_90,local_98);
      (*pFVar7->_vptr_Filter[2])(pFVar7,&local_a8);
      in_RDI[(long)local_7c + 0x10] = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      local_7c = local_7c + 1;
    }
  }
  return;
}

Assistant:

Film::Film(const Point2i& resolution, const Bounds2f& cropWindow,
           std::unique_ptr<Filter> _filter, Real filmSize,
           const std::string& filename, Real scale) :
    resolution(resolution), filmSize(filmSize * .001), filter(std::move(_filter)),
    filename(filename), scale(scale) {
    // Compute film image bounds
    croppedImageBounds = Bounds2i(Point2i(std::ceil(resolution.x * cropWindow.pMin.x),
                                          std::ceil(resolution.y * cropWindow.pMin.y)),
                                  Point2i(std::ceil(resolution.x * cropWindow.pMax.x),
                                          std::ceil(resolution.y * cropWindow.pMax.y)));

    // Allocate memory for image pixels
    pixels = std::unique_ptr<Pixel[]>(new Pixel[croppedImageBounds.area()]);

    // Precompute filter weight table
    Real invFilterTableSize = Real(1) / filterTableSize;
    int offset = 0;

    for (int y = 0; y < filterTableSize; y++) {
        for (int x = 0; x < filterTableSize; x++) {
            Real px, py;
            px = (x + 0.5) * filter->radius.x * invFilterTableSize;
            py = (y + 0.5) * filter->radius.y * invFilterTableSize;
            filterTable[offset++] = filter->evaluate(Point2f(px, py));
        }
    }
}